

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O1

void __thiscall OpenMD::OpenMDBitSet::resize(OpenMDBitSet *this,size_t nbits)

{
  ulong *puVar1;
  uint uVar2;
  ulong *puVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *__s;
  
  uVar6 = (ulong)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->bitset_,nbits,false);
  if (uVar6 < nbits) {
    uVar5 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar5 = uVar6;
    }
    puVar1 = (ulong *)(((long)uVar5 >> 6) * 8 +
                       (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8);
    __s = puVar1 + -1;
    puVar3 = (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar2 = (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    bVar4 = (byte)uVar6;
    if (__s == puVar3) {
      if (((uint)uVar6 & 0x3f) == uVar2) {
        return;
      }
      uVar6 = ((0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU)) >> (bVar4 & 0x3f)) << (bVar4 & 0x3f);
    }
    else {
      if ((uVar6 & 0x3f) != 0) {
        *__s = *__s & ~(-1L << (bVar4 & 0x3f));
        __s = puVar1;
      }
      memset(__s,0,(long)puVar3 - (long)__s);
      if (uVar2 == 0) {
        return;
      }
      uVar6 = 0xffffffffffffffff >> (-(char)uVar2 & 0x3fU);
      __s = puVar3;
    }
    *__s = *__s & ~uVar6;
  }
  return;
}

Assistant:

void OpenMDBitSet::resize(size_t nbits) {
    size_t oldSize = size();
    bitset_.resize(nbits);
    if (nbits > oldSize) {
      std::fill(bitset_.begin() + oldSize, bitset_.end(), false);
    }
  }